

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

void replace_in_place(QString *str,QSpan<unsigned_long,_18446744073709551615UL> indices,
                     qsizetype blen,QStringView after)

{
  char16_t *pcVar1;
  char16_t *pcVar2;
  longlong __n2;
  unsigned_long uVar3;
  unsigned_long *puVar4;
  char16_t *__src;
  storage_type_conflict *__src_00;
  long lVar5;
  char16_t *pcVar6;
  long lVar7;
  size_t sVar8;
  long lVar9;
  long lVar10;
  reverse_iterator end;
  
  lVar5 = after.m_size;
  __src_00 = after.m_data;
  lVar10 = indices.super_QSpanBase<unsigned_long,_18446744073709551615UL>.m_size;
  puVar4 = indices.super_QSpanBase<unsigned_long,_18446744073709551615UL>.m_data;
  if (lVar5 - blen == 0) {
    for (lVar7 = 0; lVar10 << 3 != lVar7; lVar7 = lVar7 + 8) {
      if (0 < lVar5) {
        memmove((str->d).ptr + *(long *)((long)puVar4 + lVar7),__src_00,lVar5 * 2);
      }
    }
  }
  else {
    if (lVar5 < blen) {
      pcVar1 = (str->d).ptr;
      uVar3 = *puVar4;
      pcVar6 = pcVar1 + uVar3;
      if (0 < lVar5) {
        memmove(pcVar6,__src_00,lVar5 * 2);
        pcVar6 = pcVar6 + lVar5;
      }
      for (lVar7 = 8; pcVar2 = pcVar1 + blen + uVar3, lVar10 << 3 != lVar7; lVar7 = lVar7 + 8) {
        uVar3 = *(unsigned_long *)((long)puVar4 + lVar7);
        sVar8 = (long)pcVar1 + (uVar3 * 2 - (long)pcVar2);
        if (sVar8 != 0) {
          memmove(pcVar6,pcVar2,sVar8);
        }
        pcVar6 = (char16_t *)((long)pcVar6 + sVar8);
        if (0 < lVar5) {
          memmove(pcVar6,__src_00,lVar5 * 2);
          pcVar6 = pcVar6 + lVar5;
        }
      }
      sVar8 = (long)(str->d).ptr + ((str->d).size * 2 - (long)pcVar2);
      if (sVar8 != 0) {
        memmove(pcVar6,pcVar2,sVar8);
      }
      QString::resize(str,(long)((long)pcVar6 + (sVar8 - (long)pcVar1)) >> 1);
      return;
    }
    lVar7 = (str->d).size;
    QString::resize(str,(lVar5 - blen) * lVar10 + lVar7);
    pcVar1 = (str->d).ptr;
    pcVar6 = pcVar1 + (str->d).size;
    pcVar2 = pcVar1 + lVar7;
    for (lVar10 = lVar10 << 3; lVar10 != 0; lVar10 = lVar10 + -8) {
      lVar7 = *(long *)((long)puVar4 + lVar10 + -8);
      __src = pcVar1 + lVar7 + blen;
      lVar9 = (long)pcVar2 - (long)__src >> 1;
      if ((long)pcVar2 - (long)__src != 0) {
        memmove(pcVar6 + -lVar9,__src,(long)pcVar2 - (long)__src);
      }
      if (lVar5 != 0) {
        memmove(pcVar6 + (-lVar9 - lVar5),__src_00,lVar5 * 2);
      }
      pcVar6 = pcVar6 + (-lVar9 - lVar5);
      pcVar2 = pcVar1 + lVar7;
    }
  }
  return;
}

Assistant:

static void replace_in_place(QString &str, QSpan<size_t> indices,
                             qsizetype blen, QStringView after)
{
    const qsizetype alen = after.size();
    const char16_t *after_b = after.utf16();
    const char16_t *after_e = after.utf16() + after.size();

    if (blen == alen) { // Replace in place
        for (size_t index : indices)
            std::copy_n(after_b, alen, str.data_ptr().begin() + index);
    } else if (blen > alen) { // Replace from front
        char16_t *begin = str.data_ptr().begin();
        char16_t *hit = begin + indices.front();
        char16_t *to = hit;
        to = std::copy_n(after_b, alen, to);
        char16_t *movestart = hit + blen;
        for (size_t index : indices.sliced(1)) {
            hit = begin + index;
            to = std::move(movestart, hit, to);
            to = std::copy_n(after_b, alen, to);
            movestart = hit + blen;
        }
        to = std::move(movestart, str.data_ptr().end(), to);
        str.resize(std::distance(begin, to));
    } else { // blen < alen, Replace from back
        const qsizetype oldSize = str.data_ptr().size;
        const qsizetype adjust = indices.size() * (alen - blen);
        const qsizetype newSize = oldSize + adjust;

        str.resize(newSize);
        char16_t *begin = str.data_ptr().begin();
        char16_t *moveend = begin + oldSize;
        char16_t *to = str.data_ptr().end();

        for (auto it = indices.rbegin(), end = indices.rend(); it != end; ++it) {
            char16_t *hit = begin + *it;
            char16_t *movestart = hit + blen;
            to = std::move_backward(movestart, moveend, to);
            to = std::copy_backward(after_b, after_e, to);
            moveend = hit;
        }
    }
}